

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O3

DdNode * Cudd_addBddInterval(DdManager *dd,DdNode *f,double lower,double upper)

{
  int *piVar1;
  DdNode *l;
  DdNode *u;
  DdNode *pDVar2;
  
  l = cuddUniqueConst(dd,lower);
  if (l != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)l & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    u = cuddUniqueConst(dd,upper);
    if (u != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)u & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      do {
        dd->reordered = 0;
        pDVar2 = addBddDoInterval(dd,f,l,u);
      } while (dd->reordered == 1);
      if (pDVar2 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,l);
        Cudd_RecursiveDeref(dd,u);
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar2;
      }
      Cudd_RecursiveDeref(dd,l);
      l = u;
    }
    Cudd_RecursiveDeref(dd,l);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addBddInterval(
  DdManager * dd,
  DdNode * f,
  CUDD_VALUE_TYPE  lower,
  CUDD_VALUE_TYPE  upper)
{
    DdNode *res;
    DdNode *l;
    DdNode *u;
    
    /* Create constant nodes for the interval bounds, so that we can use
    ** the global cache.
    */
    l = cuddUniqueConst(dd,lower);
    if (l == NULL) return(NULL);
    cuddRef(l);
    u = cuddUniqueConst(dd,upper);
    if (u == NULL) {
        Cudd_RecursiveDeref(dd,l);
        return(NULL);
    }
    cuddRef(u);

    do {
        dd->reordered = 0;
        res = addBddDoInterval(dd, f, l, u);
    } while (dd->reordered == 1);

    if (res == NULL) {
        Cudd_RecursiveDeref(dd, l);
        Cudd_RecursiveDeref(dd, u);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, l);
    Cudd_RecursiveDeref(dd, u);
    cuddDeref(res);
    return(res);

}